

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxTree.cpp
# Opt level: O3

TreeOrError * __thiscall
slang::syntax::SyntaxTree::fromFile
          (TreeOrError *__return_storage_ptr__,SyntaxTree *this,string_view path,
          SourceManager *sourceManager,Bag *options)

{
  span<const_slang::SourceBuffer,_18446744073709551615UL> sources;
  MacroList inheritedMacros;
  BufferOrError buffer;
  basic_string_view<char,_std::char_traits<char>_> local_b8;
  undefined1 local_a8 [40];
  BufferOrError local_80 [2];
  
  local_b8._M_str = (char *)path._M_len;
  local_b8._M_len = (size_t)this;
  std::filesystem::__cxx11::path::
  path<std::basic_string_view<char,std::char_traits<char>>,std::filesystem::__cxx11::path>
            ((path *)local_a8,&local_b8,auto_format);
  SourceManager::readSource
            (local_80,(SourceManager *)path._M_str,(path *)local_a8,(SourceLibrary *)0x0,
             0xffffffffffffffff);
  std::filesystem::__cxx11::path::~path((path *)local_a8);
  if (local_80[0].contained.super_storage_t_impl<slang::SourceBuffer,_std::error_code>.m_has_value
      == false) {
    (__return_storage_ptr__->contained).
    super_storage_t_impl<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<std::error_code,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
    .field_0.m_error.second._M_len = local_b8._M_len;
    (__return_storage_ptr__->contained).
    super_storage_t_impl<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<std::error_code,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
    .field_0.m_error.second._M_str = local_b8._M_str;
    (__return_storage_ptr__->contained).
    super_storage_t_impl<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<std::error_code,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
    .field_0.m_value.super___shared_ptr<slang::syntax::SyntaxTree,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)
             local_80[0].contained.super_storage_t_impl<slang::SourceBuffer,_std::error_code>.
             field_0._0_8_;
    (__return_storage_ptr__->contained).
    super_storage_t_impl<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<std::error_code,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
    .field_0.m_value.super___shared_ptr<slang::syntax::SyntaxTree,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         local_80[0].contained.super_storage_t_impl<slang::SourceBuffer,_std::error_code>.field_0.
         _8_8_;
  }
  else {
    local_80[1].contained.super_storage_t_impl<slang::SourceBuffer,_std::error_code>.field_0._0_8_ =
         0;
    local_80[1].contained.super_storage_t_impl<slang::SourceBuffer,_std::error_code>.field_0._8_8_ =
         0;
    sources._M_extent._M_extent_value = (size_t)local_80;
    sources._M_ptr = (pointer)path._M_str;
    inheritedMacros._M_extent._M_extent_value = 0;
    inheritedMacros._M_ptr = (pointer)sourceManager;
    create((SourceManager *)local_a8,sources,(Bag *)0x1,inheritedMacros,false);
    (__return_storage_ptr__->contained).
    super_storage_t_impl<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<std::error_code,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
    .field_0.m_value.super___shared_ptr<slang::syntax::SyntaxTree,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)local_a8._0_8_;
    (__return_storage_ptr__->contained).
    super_storage_t_impl<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<std::error_code,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
    .field_0.m_value.super___shared_ptr<slang::syntax::SyntaxTree,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._8_8_;
  }
  (__return_storage_ptr__->contained).
  super_storage_t_impl<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<std::error_code,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
  .m_has_value = local_80[0].contained.super_storage_t_impl<slang::SourceBuffer,_std::error_code>.
                 m_has_value != false;
  return __return_storage_ptr__;
}

Assistant:

SyntaxTree::TreeOrError SyntaxTree::fromFile(std::string_view path, SourceManager& sourceManager,
                                             const Bag& options) {
    auto buffer = sourceManager.readSource(path, /* library */ nullptr);
    if (!buffer)
        return nonstd::make_unexpected(std::pair{buffer.error(), path});
    return create(sourceManager, std::span(&buffer.value(), 1), options, {}, false);
}